

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O1

void __thiscall
nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
          (AsyncQueue<nrg::TimedExecution> *this,duration<long,_std::ratio<1L,_1000L>_> *param,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_char_ptr_ptr *param_2,
          reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_3,
          char (*param_4) [12])

{
  long lVar1;
  int iVar2;
  time_point local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    local_38.__d.__r = (duration)(param->__r * 1000000 + lVar1);
    TimedExecution::
    push<void(*)(std::ostream&,char_const*const&),std::reference_wrapper<std::ostream>,char_const(&)[12]>
              (&this->queue_,&local_38,param_2,param_3,param_4);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }